

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O0

rt_function_error_t exec_matrix_diag_generic(rt_function_t *f)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int local_20;
  float x;
  int j;
  int i;
  matrix_diag_local_context_t *context;
  rt_function_t *f_local;
  
  puVar1 = (undefined8 *)f->local_context;
  for (x = 0.0; (int)x < *(int *)(puVar1 + 2); x = (float)((int)x + 1)) {
    for (local_20 = 0; local_20 < *(int *)((long)puVar1 + 0x2c); local_20 = local_20 + 1) {
      if ((int)x % *(int *)((long)puVar1 + 0x2c) == local_20) {
        uVar2 = (*(code *)puVar1[1])(*puVar1,x);
        (*(code *)puVar1[4])(uVar2,puVar1[3],(int)x * *(int *)((long)puVar1 + 0x2c) + local_20);
      }
      else {
        (*(code *)puVar1[4])(0,puVar1[3],(int)x * *(int *)((long)puVar1 + 0x2c) + local_20);
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag_generic(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        float x = context->get_input(context->input, i);
        context->set_output(context->output, i * context->last_ndim + j, x);
      } else {
        context->set_output(context->output, i * context->last_ndim + j, 0.);
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}